

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_3,_3> * __thiscall
tcu::transpose<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,tcu *this,Matrix<float,_3,_3> *mat)

{
  int row;
  long lVar1;
  Vector<float,_3> *pVVar2;
  tcu *ptVar3;
  long lVar4;
  
  Matrix<float,_3,_3>::Matrix(__return_storage_ptr__);
  pVVar2 = (Vector<float,_3> *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    ptVar3 = this;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar2->m_data)->m_data[0].m_data[lVar4] =
           *(float *)ptVar3;
      ptVar3 = ptVar3 + 0xc;
    }
    pVVar2 = pVVar2 + 1;
    this = this + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}